

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_2,
          uint32_t *out,size_t *nvalue)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar3;
  NotEnoughStorage *this_00;
  uint32_t uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  size_t out_len;
  long local_40;
  ulong *local_38;
  uint32_t *puVar2;
  
  uVar4 = *in;
  uVar3 = *nvalue;
  if (uVar3 < uVar4 << 7) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = in + 1;
  local_40 = 0;
  puVar5 = out;
  if (uVar4 != 0) {
    local_38 = nvalue;
    do {
      iVar1 = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[0xb])(this,puVar2,puVar5,&local_40);
      puVar2 = (uint32_t *)CONCAT44(extraout_var,iVar1);
      uVar4 = uVar4 - 1;
      puVar5 = puVar5 + local_40;
    } while (uVar4 != 0);
    uVar3 = *local_38;
    nvalue = local_38;
  }
  uVar6 = (long)puVar5 - (long)out >> 2;
  if (uVar3 < uVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"possible buffer overrun",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  *nvalue = uVar6;
  return puVar2;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;
  size_t out_len = 0;
  for (uint32_t i = 0; i < numBlocks; i++) {
    in = decodeBlock(in, out, out_len);
    out += out_len;
  }

  if (static_cast<size_t>(out - initout) > nvalue) {
    std::cerr << "possible buffer overrun" << std::endl;
  }
  ASSERT(in <= len + initin, in - initin << " " << len);

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}